

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectAddress * __thiscall
Js::SlotArrayVariablesWalker::GetObjectAddress(SlotArrayVariablesWalker *this,int index)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  LocalObjectAddressForSlot *this_00;
  Type *ppDVar5;
  ScopeSlots local_60;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  undefined1 local_20 [8];
  ScopeSlots slotArray;
  int index_local;
  SlotArrayVariablesWalker *this_local;
  
  slotArray.slotArray.ptr._4_4_ = index;
  iVar3 = JsUtil::
          ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>::
          Count(&((this->super_VariableWalkerBase).pMembersList)->
                 super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
               );
  if (iVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x29e,"(index < pMembersList->Count())",
                                "index < pMembersList->Count()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  GetSlotArray((SlotArrayVariablesWalker *)local_20);
  iVar3 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[0xe])();
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&LocalObjectAddressForSlot::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0x2a0);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                     CONCAT44(extraout_var,iVar3),&local_48);
  local_58 = Memory::ArenaAllocator::Alloc;
  local_50 = 0;
  this_00 = (LocalObjectAddressForSlot *)
            new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)alloc,0x3f67b0);
  ScopeSlots::ScopeSlots(&local_60,(ScopeSlots *)local_20);
  iVar3 = slotArray.slotArray.ptr._4_4_;
  ppDVar5 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((this->super_VariableWalkerBase).pMembersList,slotArray.slotArray.ptr._4_4_);
  LocalObjectAddressForSlot::LocalObjectAddressForSlot(this_00,&local_60,iVar3,(*ppDVar5)->aVar);
  return &this_00->super_IDiagObjectAddress;
}

Assistant:

IDiagObjectAddress * SlotArrayVariablesWalker::GetObjectAddress(int index)
    {
        Assert(index < pMembersList->Count());
        ScopeSlots slotArray = GetSlotArray();
        return Anew(pFrame->GetArena(), LocalObjectAddressForSlot, slotArray, index, pMembersList->Item(index)->aVar);
    }